

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O0

void __thiscall
crnlib::vector<unsigned_char>::insert(vector<unsigned_char> *this,uint index,uchar *p,uint n)

{
  uint in_ECX;
  void *in_RDX;
  uint in_ESI;
  long *in_RDI;
  uchar *pDst;
  uint num_to_move;
  uint orig_size;
  bool in_stack_ffffffffffffffdb;
  uint in_stack_ffffffffffffffdc;
  int iVar1;
  
  if (in_ECX != 0) {
    iVar1 = (int)in_RDI[1];
    resize((vector<unsigned_char> *)CONCAT44(in_ECX,iVar1),in_stack_ffffffffffffffdc,
           in_stack_ffffffffffffffdb);
    memmove((void *)(*in_RDI + (ulong)in_ESI + (ulong)in_ECX),(void *)(*in_RDI + (ulong)in_ESI),
            (ulong)(iVar1 - in_ESI));
    memcpy((void *)(*in_RDI + (ulong)in_ESI),in_RDX,(ulong)in_ECX);
  }
  return;
}

Assistant:

inline void insert(uint index, const T* p, uint n) {
    CRNLIB_ASSERT(index <= m_size);
    if (!n)
      return;

    const uint orig_size = m_size;
    resize(m_size + n, true);

    const uint num_to_move = orig_size - index;

    if (CRNLIB_IS_BITWISE_COPYABLE(T)) {
      // This overwrites the destination object bits, but bitwise copyable means we don't need to worry about destruction.
      memmove(m_p + index + n, m_p + index, sizeof(T) * num_to_move);
    } else {
      const T* pSrc = m_p + orig_size - 1;
      T* pDst = const_cast<T*>(pSrc) + n;

      for (uint i = 0; i < num_to_move; i++) {
        CRNLIB_ASSERT((pDst - m_p) < (int)m_size);
        *pDst-- = *pSrc--;
      }
    }

    T* pDst = m_p + index;

    if (CRNLIB_IS_BITWISE_COPYABLE(T)) {
      // This copies in the new bits, overwriting the existing objects, which is OK for copyable types that don't need destruction.
      memcpy(pDst, p, sizeof(T) * n);
    } else {
      for (uint i = 0; i < n; i++) {
        CRNLIB_ASSERT((pDst - m_p) < (int)m_size);
        *pDst++ = *p++;
      }
    }
  }